

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O3

rt_function_error_t exec_deconvolution(rt_function_t *f)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  uint *puVar4;
  void *__s;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int local_88;
  float local_80;
  
  plVar2 = (long *)f->local_context;
  plVar3 = (long *)*plVar2;
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar3 + 0xb);
  shape.data = (int *)plVar3[0xc];
  uVar9 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar3 + 0xd);
  shape_00.data = (int *)plVar3[0xe];
  uVar10 = calc_shape_size(shape_00);
  shape_01._4_4_ = 0;
  shape_01.size = *(uint *)(plVar3 + 9);
  shape_01.data = (int *)plVar3[10];
  iVar11 = calc_shape_size(shape_01);
  puVar4 = (uint *)plVar3[6];
  __s = *(void **)(puVar4 + 6);
  shape_02._4_4_ = 0;
  shape_02.size = *puVar4;
  shape_02.data = *(int **)(puVar4 + 2);
  iVar12 = calc_shape_size(shape_02);
  iVar16 = 0;
  memset(__s,0,(long)iVar12 << 2);
  iVar12 = *(int *)((long)plVar3 + 0x9c);
  if (0 < iVar12) {
    iVar21 = (int)plVar2[8];
    do {
      if (0 < iVar21) {
        lVar15 = plVar3[2];
        local_88 = 0;
        do {
          piVar20 = *(int **)(lVar15 + 8);
          uVar22 = (ulong)(uint)piVar20[1];
          if (0 < piVar20[1]) {
            lVar24 = 0;
            do {
              iVar23 = ((iVar21 * iVar16 + local_88) * (int)uVar22 + (int)lVar24) * uVar9;
              iVar12 = *piVar20;
              if (0 < iVar12 / iVar21) {
                iVar19 = 0;
                do {
                  if (0 < (int)uVar9) {
                    iVar1 = piVar20[1];
                    uVar22 = 0;
                    do {
                      out._4_4_ = 0;
                      out.size = *(uint *)(plVar3 + 0x11);
                      shape_04._4_4_ = 0;
                      shape_04.size = *(uint *)(plVar3 + 0xb);
                      out.data = (int *)plVar3[0x12];
                      shape_04.data = (int *)plVar3[0xc];
                      pos_to_shape(out,shape_04,(int)uVar22);
                      if ((int)uVar10 < 1) {
                        local_80 = 0.0;
                      }
                      else {
                        local_80 = 0.0;
                        uVar25 = 0;
                        do {
                          out_00._4_4_ = 0;
                          out_00.size = *(uint *)(plVar3 + 0xf);
                          shape_05._4_4_ = 0;
                          shape_05.size = *(uint *)(plVar3 + 0xd);
                          out_00.data = (int *)plVar3[0x10];
                          shape_05.data = (int *)plVar3[0xe];
                          pos_to_shape(out_00,shape_05,(int)uVar25);
                          if ((int)plVar3[0x13] < 1) {
                            piVar20 = (int *)plVar3[10];
                          }
                          else {
                            lVar15 = plVar2[7];
                            lVar5 = plVar3[0xe];
                            lVar17 = plVar3[0x10];
                            lVar6 = plVar2[3];
                            lVar7 = plVar2[5];
                            lVar8 = plVar3[0x12];
                            lVar26 = 0;
                            do {
                              iVar14 = *(int *)(lVar15 + lVar26 * 4);
                              iVar13 = *(int *)(lVar5 + lVar26 * 4);
                              iVar18 = iVar14 * *(int *)(lVar17 + lVar26 * 4);
                              *(int *)(lVar17 + lVar26 * 4) = iVar18;
                              iVar18 = (*(int *)(lVar6 + lVar26 * 4) - (iVar13 + -1) * iVar14) +
                                       iVar18;
                              *(int *)(lVar17 + lVar26 * 4) = iVar18;
                              iVar18 = iVar18 + *(int *)(lVar8 + lVar26 * 4);
                              *(int *)(lVar17 + lVar26 * 4) = iVar18;
                              iVar14 = *(int *)(lVar7 + lVar26 * 4);
                              iVar13 = iVar18 / iVar14;
                              if (((iVar18 % iVar14 != 0) ||
                                  (*(int *)(lVar17 + lVar26 * 4) = iVar13, iVar13 < 0)) ||
                                 (piVar20 = (int *)plVar3[10], piVar20[lVar26] <= iVar13))
                              goto LAB_0011ce89;
                              lVar26 = lVar26 + 1;
                            } while (lVar26 < (int)plVar3[0x13]);
                          }
                          lVar15 = *(long *)(*plVar3 + 0x18);
                          shape_03._4_4_ = 0;
                          shape_03.size = *(uint *)(plVar3 + 9);
                          pos._4_4_ = 0;
                          pos.size = *(uint *)(plVar3 + 0xf);
                          shape_03.data = piVar20;
                          pos.data = (int *)plVar3[0x10];
                          iVar14 = shape_to_pos(shape_03,pos);
                          local_80 = local_80 +
                                     *(float *)(lVar15 + (long)(((iVar12 * local_88) / iVar21 +
                                                                iVar12 * iVar16 + iVar19) * iVar11)
                                                         * 4 + (long)iVar14 * 4) *
                                     *(float *)(*(long *)(plVar3[2] + 0x18) +
                                                (long)(int)(((iVar1 * iVar12 * local_88) / iVar21 +
                                                            iVar1 * iVar19 + (int)lVar24) * uVar10)
                                                * 4 + (long)(int)uVar10 * 4 + ~uVar25 * 4);
LAB_0011ce89:
                          uVar25 = uVar25 + 1;
                        } while (uVar25 != uVar10);
                      }
                      lVar15 = *(long *)(plVar3[6] + 0x18) + (long)iVar23 * 4;
                      *(float *)(lVar15 + uVar22 * 4) = local_80 + *(float *)(lVar15 + uVar22 * 4);
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar9);
                    lVar15 = plVar3[2];
                    iVar21 = (int)plVar2[8];
                  }
                  iVar19 = iVar19 + 1;
                  piVar20 = *(int **)(lVar15 + 8);
                  iVar12 = *piVar20;
                } while (iVar19 < iVar12 / iVar21);
              }
              if (plVar3[4] != 0 && 0 < (int)uVar9) {
                iVar12 = piVar20[1];
                lVar5 = *(long *)(plVar3[4] + 0x18);
                lVar17 = (long)iVar23 * 4 + *(long *)(plVar3[6] + 0x18);
                uVar22 = 0;
                do {
                  *(float *)(lVar17 + uVar22 * 4) =
                       *(float *)((long)local_88 * (long)iVar12 * 4 + lVar5 + lVar24 * 4) +
                       *(float *)(lVar17 + uVar22 * 4);
                  uVar22 = uVar22 + 1;
                } while (uVar9 != uVar22);
              }
              lVar24 = lVar24 + 1;
              piVar20 = *(int **)(lVar15 + 8);
              uVar22 = (ulong)piVar20[1];
            } while (lVar24 < (long)uVar22);
          }
          local_88 = local_88 + 1;
        } while (local_88 < iVar21);
        iVar12 = *(int *)((long)plVar3 + 0x9c);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < iVar12);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_deconvolution(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);
  deconvolution_private_t *p = (deconvolution_private_t *)(c->data);

  int output_size = calc_shape_size(p->output_shape);
  int kernel_size = calc_shape_size(p->kernel_shape);
  int input_size = calc_shape_size(p->input_shape);

  memset(p->output->data, 0, sizeof(float) * calc_shape_size(p->output->shape));

  for (int b = 0; b < p->base_loop_size; b++) {
    for (int g = 0; g < c->group; g++) {
      for (int om = 0; om < p->weight->shape.data[1]; om++) {
        int output_offset = (b * c->group * p->weight->shape.data[1] +
                             g * p->weight->shape.data[1] + om) *
                            output_size;
        for (int im = 0; im < p->weight->shape.data[0] / c->group; im++) {
          int input_offset = (b * p->weight->shape.data[0] +
                              g * p->weight->shape.data[0] / c->group + im) *
                             input_size;
          int kernel_offset = (g * p->weight->shape.data[1] *
                                   p->weight->shape.data[0] / c->group +
                               im * p->weight->shape.data[1] + om) *
                              kernel_size;
          for (int o = 0; o < output_size; o++) {
            float sum = 0.0f;
            pos_to_shape(p->out_position, p->output_shape, o);
            for (int k = 0; k < kernel_size; k++) {
              pos_to_shape(p->in_position, p->kernel_shape, k);
              uint8_t condition = 1;
              for (int j = 0; j < p->spatial_dims; j++) {
                int k1 =
                    c->dilation.data[j] * (p->kernel_shape.data[j] - 1) + 1;
                p->in_position.data[j] *= c->dilation.data[j];
                p->in_position.data[j] -= k1 - c->pad.data[j] - 1;
                p->in_position.data[j] += p->out_position.data[j];
                if (p->in_position.data[j] % c->stride.data[j] != 0) {
                  condition = 0;
                  break;
                }
                p->in_position.data[j] =
                    p->in_position.data[j] / c->stride.data[j];
                if (p->in_position.data[j] < 0 ||
                    p->in_position.data[j] >= p->input_shape.data[j]) {
                  condition = 0;
                  break;
                }
              }
              if (condition) {
                float x = *((float *)(p->input->data) + input_offset +
                            shape_to_pos(p->input_shape, p->in_position));
                float w = *((float *)(p->weight->data) + kernel_offset +
                            (kernel_size - k - 1));
                sum += x * w;
              }
            }
            *((float *)(p->output->data) + output_offset + o) += sum;
          }
        }
        if (p->bias) {
          for (int o = 0; o < output_size; o++) {
            *((float *)(p->output->data) + output_offset + o) +=
                *((float *)(p->bias->data) + g * p->weight->shape.data[1] + om);
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}